

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

char * print_array(cJSON *item,int depth,int fmt,printbuffer *p)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  void *__s;
  size_t sVar6;
  size_t tmplen;
  int local_60;
  int fail;
  int i;
  int numentries;
  cJSON *child;
  int len;
  char *ret;
  char *ptr;
  char *out;
  char **entries;
  printbuffer *p_local;
  int fmt_local;
  int depth_local;
  cJSON *item_local;
  
  ptr = (char *)0x0;
  child._4_4_ = 5;
  _i = item->child;
  fail = 0;
  local_60 = 0;
  bVar2 = false;
  for (; _i != (cJSON *)0x0; _i = _i->next) {
    fail = fail + 1;
  }
  if (fail == 0) {
    if (p == (printbuffer *)0x0) {
      ptr = (char *)(*cJSON_malloc)(3);
    }
    else {
      ptr = ensure(p,3);
    }
    if (ptr != (char *)0x0) {
      strcpy(ptr,"[]");
    }
    return ptr;
  }
  if (p == (printbuffer *)0x0) {
    __s = (*cJSON_malloc)((long)fail << 3);
    if (__s == (void *)0x0) {
      return (char *)0x0;
    }
    memset(__s,0,(long)fail << 3);
    _i = item->child;
    while( true ) {
      bVar3 = false;
      if (_i != (cJSON *)0x0) {
        bVar3 = (bool)(bVar2 ^ 1);
      }
      if (!bVar3) break;
      pcVar5 = print_value(_i,depth + 1,fmt,(printbuffer *)0x0);
      *(char **)((long)__s + (long)local_60 * 8) = pcVar5;
      if (pcVar5 == (char *)0x0) {
        bVar2 = true;
      }
      else {
        sVar6 = strlen(pcVar5);
        child._4_4_ = child._4_4_ + (int)sVar6 + 2 + (uint)(fmt != 0);
      }
      _i = _i->next;
      local_60 = local_60 + 1;
    }
    if (!bVar2) {
      ptr = (char *)(*cJSON_malloc)((long)child._4_4_);
    }
    if (ptr == (char *)0x0) {
      bVar2 = true;
    }
    if (bVar2) {
      for (local_60 = 0; local_60 < fail; local_60 = local_60 + 1) {
        if (*(long *)((long)__s + (long)local_60 * 8) != 0) {
          (*cJSON_free)(*(void **)((long)__s + (long)local_60 * 8));
        }
      }
      (*cJSON_free)(__s);
      return (char *)0x0;
    }
    *ptr = '[';
    ret = ptr + 1;
    *ret = '\0';
    for (local_60 = 0; local_60 < fail; local_60 = local_60 + 1) {
      sVar6 = strlen(*(char **)((long)__s + (long)local_60 * 8));
      memcpy(ret,*(void **)((long)__s + (long)local_60 * 8),sVar6);
      pcVar5 = ret + sVar6;
      ret = pcVar5;
      if (local_60 != fail + -1) {
        *pcVar5 = ',';
        ret = pcVar5 + 1;
        if (fmt != 0) {
          ret = pcVar5 + 2;
          pcVar5[1] = ' ';
        }
        *ret = '\0';
      }
      (*cJSON_free)(*(void **)((long)__s + (long)local_60 * 8));
    }
    (*cJSON_free)(__s);
    *ret = ']';
    ret[1] = '\0';
  }
  else {
    iVar1 = p->offset;
    pcVar5 = ensure(p,1);
    if (pcVar5 == (char *)0x0) {
      return (char *)0x0;
    }
    *pcVar5 = '[';
    p->offset = p->offset + 1;
    for (_i = item->child; _i != (cJSON *)0x0; _i = _i->next) {
      print_value(_i,depth + 1,fmt,p);
      iVar4 = update(p);
      p->offset = iVar4;
      if (_i->next != (cJSON *)0x0) {
        iVar4 = 1;
        if (fmt != 0) {
          iVar4 = 2;
        }
        pcVar5 = ensure(p,iVar4 + 1);
        if (pcVar5 == (char *)0x0) {
          return (char *)0x0;
        }
        *pcVar5 = ',';
        ret = pcVar5 + 1;
        if (fmt != 0) {
          ret = pcVar5 + 2;
          pcVar5[1] = ' ';
        }
        *ret = '\0';
        p->offset = iVar4 + p->offset;
      }
    }
    pcVar5 = ensure(p,2);
    if (pcVar5 == (char *)0x0) {
      return (char *)0x0;
    }
    *pcVar5 = ']';
    pcVar5[1] = '\0';
    ptr = p->buffer + iVar1;
  }
  return ptr;
}

Assistant:

static char *print_array(cJSON *item,int depth,int fmt,printbuffer *p)
{
	char **entries;
	char *out=0,*ptr,*ret;int len=5;
	cJSON *child=item->child;
	int numentries=0,i=0,fail=0;
	size_t tmplen=0;
	
	/* How many entries in the array? */
	while (child) numentries++,child=child->next;
	/* Explicitly handle numentries==0 */
	if (!numentries)
	{
		if (p)	out=ensure(p,3);
		else	out=(char*)cJSON_malloc(3);
		if (out) strcpy(out,"[]");
		return out;
	}

	if (p)
	{
		/* Compose the output array. */
		i=p->offset;
		ptr=ensure(p,1);if (!ptr) return 0;	*ptr='[';	p->offset++;
		child=item->child;
		while (child && !fail)
		{
			print_value(child,depth+1,fmt,p);
			p->offset=update(p);
			if (child->next) {len=fmt?2:1;ptr=ensure(p,len+1);if (!ptr) return 0;*ptr++=',';if(fmt)*ptr++=' ';*ptr=0;p->offset+=len;}
			child=child->next;
		}
		ptr=ensure(p,2);if (!ptr) return 0;	*ptr++=']';*ptr=0;
		out=(p->buffer)+i;
	}
	else
	{
		/* Allocate an array to hold the values for each */
		entries=(char**)cJSON_malloc(numentries*sizeof(char*));
		if (!entries) return 0;
		memset(entries,0,numentries*sizeof(char*));
		/* Retrieve all the results: */
		child=item->child;
		while (child && !fail)
		{
			ret=print_value(child,depth+1,fmt,0);
			entries[i++]=ret;
			if (ret) len+=strlen(ret)+2+(fmt?1:0); else fail=1;
			child=child->next;
		}
		
		/* If we didn't fail, try to malloc the output string */
		if (!fail)	out=(char*)cJSON_malloc(len);
		/* If that fails, we fail. */
		if (!out) fail=1;

		/* Handle failure. */
		if (fail)
		{
			for (i=0;i<numentries;i++) if (entries[i]) cJSON_free(entries[i]);
			cJSON_free(entries);
			return 0;
		}
		
		/* Compose the output array. */
		*out='[';
		ptr=out+1;*ptr=0;
		for (i=0;i<numentries;i++)
		{
			tmplen=strlen(entries[i]);memcpy(ptr,entries[i],tmplen);ptr+=tmplen;
			if (i!=numentries-1) {*ptr++=',';if(fmt)*ptr++=' ';*ptr=0;}
			cJSON_free(entries[i]);
		}
		cJSON_free(entries);
		*ptr++=']';*ptr++=0;
	}
	return out;	
}